

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  char *pcVar1;
  ulong uVar2;
  pointer pcVar3;
  string arg;
  cmOutputConverter converter;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = GetCrossCompilingEmulator(this,c);
  pcVar3 = (this->CommandLines).
           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start + c;
  for (uVar2 = (ulong)(pcVar1 == (char *)0x0);
      uVar2 < (ulong)((long)*(pointer *)
                             ((long)&(pcVar3->
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             + 8) -
                      *(long *)&(pcVar3->
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     >> 5); uVar2 = (ulong)((int)uVar2 + 1)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    if ((uVar2 == 0) && (pcVar1 = GetArgv0Location(this,c), pcVar1 != (char *)0x0)) {
      std::__cxx11::string::assign((char *)&local_90);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    std::__cxx11::string::append((char *)cmd);
    if (this->OldStyle == true) {
      escapeForShellOldStyle(&local_70,&local_90);
      std::__cxx11::string::append((string *)cmd);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_50,this->LG);
      cmOutputConverter::cmOutputConverter
                ((cmOutputConverter *)&local_70,(cmStateSnapshot *)&local_50);
      cmOutputConverter::EscapeForShell
                (&local_50,(cmOutputConverter *)&local_70,&local_90,this->MakeVars,false,false);
      std::__cxx11::string::append((string *)cmd);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  if (this->GetCrossCompilingEmulator(c) != CM_NULLPTR) {
    offset = 0;
  }
  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location =
          j == 0 ? this->GetArgv0Location(c) : CM_NULLPTR) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmOutputConverter converter(this->LG->GetStateSnapshot());
      cmd += converter.EscapeForShell(arg, this->MakeVars);
    }
  }
}